

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine.cpp
# Opt level: O0

void __thiscall QPaintEngine::drawTextItem(QPaintEngine *this,QPointF *p,QTextItem *textItem)

{
  value_type_conflict1 vVar1;
  long *plVar2;
  bool bVar3;
  Int IVar4;
  StyleStrategy SVar5;
  reference pvVar6;
  reference pvVar7;
  QPainter *this_00;
  QVarLengthArray<unsigned_int,_256LL> *in_RDX;
  QGlyphLayout *in_RSI;
  QFontEngine *in_RDI;
  long in_FS_OFFSET;
  int i;
  QTextItemInt *ti;
  QPainterPath path;
  QImage glyph;
  QTransform matrix;
  QVarLengthArray<unsigned_int,_256LL> glyphs;
  QVarLengthArray<QFixedPoint,_256LL> positions;
  undefined4 in_stack_fffffffffffff208;
  undefined1 on;
  RenderHint in_stack_fffffffffffff20c;
  undefined4 in_stack_fffffffffffff210;
  int in_stack_fffffffffffff214;
  undefined4 in_stack_fffffffffffff218;
  FillRule in_stack_fffffffffffff21c;
  int in_stack_fffffffffffff220;
  int in_stack_fffffffffffff224;
  QPainter *in_stack_fffffffffffff228;
  QPainter *in_stack_fffffffffffff238;
  undefined4 in_stack_fffffffffffff288;
  uint in_stack_fffffffffffff28c;
  QFlagsStorage<Qt::ImageConversionFlag> flags;
  undefined4 in_stack_fffffffffffff298;
  undefined4 in_stack_fffffffffffff29c;
  int iVar8;
  QVarLengthArray<unsigned_int,_256LL> *matrix_00;
  QFlagsStorageHelper<QPainter::RenderHint,_4> local_d30;
  undefined4 local_d2c;
  undefined1 *local_d28;
  undefined4 local_d1c;
  undefined1 local_d18 [8];
  undefined1 *local_d10;
  undefined1 *local_d08;
  undefined1 *local_d00;
  QFlagsStorageHelper<QPainter::RenderHint,_4> local_cf8;
  QFlagsStorageHelper<QPainter::RenderHint,_4> local_cf4;
  undefined4 local_cf0;
  QFixed local_cec;
  undefined1 local_ce8 [16];
  undefined1 local_cd8 [80];
  undefined1 local_c88 [52];
  QFlagsStorage<QTextItem::RenderFlag> in_stack_fffffffffffff3ac;
  QVarLengthArray<unsigned_int,_256LL> local_c38;
  QVarLengthArray<QFixedPoint,_256LL> local_820;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)((in_RDX->super_QVLAStorage<4UL,_4UL,_256LL>).array + 0x58) != 0) {
    if (*(int *)(*(long *)((in_RDX->super_QVLAStorage<4UL,_4UL,_256LL>).array + 0x60) + 200) == 4) {
      matrix_00 = in_RDX;
      memset(&local_820,0xaa,0x818);
      QVarLengthArray<QFixedPoint,_256LL>::QVarLengthArray(&local_820);
      memset(&local_c38,0xaa,0x418);
      QVarLengthArray<unsigned_int,_256LL>::QVarLengthArray(&local_c38);
      memcpy(local_c88,&DAT_00bb3e90,0x50);
      QPointF::x((QPointF *)in_RSI);
      QPointF::y((QPointF *)in_RSI);
      local_cec.val =
           (**(code **)(**(long **)((in_RDX->super_QVLAStorage<4UL,_4UL,_256LL>).array + 0x60) +
                       0xf0))();
      QFixed::toReal(&local_cec);
      QTransform::fromTranslate
                ((qreal)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220),
                 (qreal)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218));
      local_cf0 = *(undefined4 *)
                   ((long)&(in_RDX->super_QVLABase<unsigned_int>).super_QVLABaseBase.s + 4);
      QFontEngine::getGlyphPositions
                (in_RDI,in_RSI,(QTransform *)matrix_00,(RenderFlags)in_stack_fffffffffffff3ac.i,
                 in_RDX,(QVarLengthArray<QFixedPoint,_256LL> *)
                        CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298));
      painter((QPaintEngine *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
      QPainter::save(in_stack_fffffffffffff238);
      painter((QPaintEngine *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
      painter((QPaintEngine *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
      local_cf8.super_QFlagsStorage<QPainter::RenderHint>.i =
           (QFlagsStorage<QPainter::RenderHint>)
           QPainter::renderHints
                     ((QPainter *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
      local_cf4.super_QFlagsStorage<QPainter::RenderHint>.i =
           (QFlagsStorage<QPainter::RenderHint>)
           QFlags<QPainter::RenderHint>::operator&
                     ((QFlags<QPainter::RenderHint> *)
                      CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
                      in_stack_fffffffffffff20c);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_cf4);
      flags.i = in_stack_fffffffffffff28c & 0xffffff;
      if (IVar4 != 0) {
        painter((QPaintEngine *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
        QPainter::font((QPainter *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
        SVar5 = QFont::styleStrategy((QFont *)0x5583f6);
        flags.i = CONCAT13((SVar5 & NoAntialias) != 0,(int3)flags.i) ^ 0xff000000;
      }
      QPainter::setRenderHint
                ((QPainter *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
                 in_stack_fffffffffffff20c,SUB41((uint)in_stack_fffffffffffff208 >> 0x18,0));
      for (iVar8 = 0; iVar8 < *(int *)((in_RDX->super_QVLAStorage<4UL,_4UL,_256LL>).array + 0x58);
          iVar8 = iVar8 + 1) {
        local_d10 = &DAT_aaaaaaaaaaaaaaaa;
        local_d08 = &DAT_aaaaaaaaaaaaaaaa;
        local_d00 = &DAT_aaaaaaaaaaaaaaaa;
        plVar2 = *(long **)((in_RDX->super_QVLAStorage<4UL,_4UL,_256LL>).array + 0x60);
        pvVar6 = QVLABase<unsigned_int>::operator[]
                           ((QVLABase<unsigned_int> *)
                            CONCAT44(in_stack_fffffffffffff20c,in_stack_fffffffffffff208),0x55849c);
        vVar1 = *pvVar6;
        QFixedPoint::QFixedPoint
                  ((QFixedPoint *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
        QTransform::QTransform
                  ((QTransform *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
        QColor::QColor((QColor *)0x5584c9);
        (**(code **)(*plVar2 + 0xb0))(&local_d10,plVar2,vVar1,local_d18,local_cd8,local_ce8);
        painter((QPaintEngine *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
        pvVar7 = QVLABase<QFixedPoint>::operator[]
                           ((QVLABase<QFixedPoint> *)
                            CONCAT44(in_stack_fffffffffffff20c,in_stack_fffffffffffff208),0x558522);
        QFixed::toReal(&pvVar7->x);
        pvVar7 = QVLABase<QFixedPoint>::operator[]
                           ((QVLABase<QFixedPoint> *)
                            CONCAT44(in_stack_fffffffffffff20c,in_stack_fffffffffffff208),0x558547);
        QFixed::toReal(&pvVar7->y);
        QFlags<Qt::ImageConversionFlag>::QFlags
                  ((QFlags<Qt::ImageConversionFlag> *)
                   CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
                   in_stack_fffffffffffff20c);
        in_stack_fffffffffffff208 = 0xffffffff;
        in_stack_fffffffffffff210 = 0xffffffff;
        QPainter::drawImage(in_stack_fffffffffffff228,in_stack_fffffffffffff224,
                            in_stack_fffffffffffff220,
                            (QImage *)CONCAT44(in_stack_fffffffffffff21c,local_d1c),
                            in_stack_fffffffffffff214,-1,(int)in_RDX,(int)matrix_00,
                            (ImageConversionFlags)flags.i);
        QImage::~QImage((QImage *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
      }
      painter((QPaintEngine *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
      QPainter::restore((QPainter *)CONCAT44(flags.i,in_stack_fffffffffffff288));
      QVarLengthArray<unsigned_int,_256LL>::~QVarLengthArray
                ((QVarLengthArray<unsigned_int,_256LL> *)
                 CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
      QVarLengthArray<QFixedPoint,_256LL>::~QVarLengthArray
                ((QVarLengthArray<QFixedPoint,_256LL> *)
                 CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
    }
    else {
      local_d28 = &DAT_aaaaaaaaaaaaaaaa;
      QPainterPath::QPainterPath((QPainterPath *)0x558617);
      on = (undefined1)((uint)in_stack_fffffffffffff208 >> 0x18);
      QPainterPath::setFillRule
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220),
                 in_stack_fffffffffffff21c);
      plVar2 = *(long **)((in_RDX->super_QVLAStorage<4UL,_4UL,_256LL>).array + 0x60);
      local_d2c = *(undefined4 *)
                   ((long)&(in_RDX->super_QVLABase<unsigned_int>).super_QVLABaseBase.s + 4);
      (**(code **)(*plVar2 + 0x80))
                (0,plVar2,(in_RDX->super_QVLAStorage<4UL,_4UL,_256LL>).array + 0x30,&local_d28,
                 local_d2c);
      bVar3 = QPainterPath::isEmpty
                        ((QPainterPath *)
                         CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
      if (!bVar3) {
        painter((QPaintEngine *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
        QPainter::save(in_stack_fffffffffffff238);
        painter((QPaintEngine *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
        painter((QPaintEngine *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
        QPainter::renderHints
                  ((QPainter *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
        local_d30.super_QFlagsStorage<QPainter::RenderHint>.i =
             (QFlagsStorage<QPainter::RenderHint>)
             QFlags<QPainter::RenderHint>::operator&
                       ((QFlags<QPainter::RenderHint> *)
                        CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
                        in_stack_fffffffffffff20c);
        IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_d30);
        if (IVar4 != 0) {
          painter((QPaintEngine *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
          QPainter::font((QPainter *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
          QFont::styleStrategy((QFont *)0x558719);
        }
        QPainter::setRenderHint
                  ((QPainter *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
                   in_stack_fffffffffffff20c,(bool)on);
        this_00 = painter((QPaintEngine *)
                          CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
        QPointF::x((QPointF *)in_RSI);
        QPointF::y((QPointF *)in_RSI);
        QPainter::translate(this_00,(qreal)CONCAT44(in_stack_fffffffffffff224,
                                                    in_stack_fffffffffffff220),
                            (qreal)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218));
        painter((QPaintEngine *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
        painter((QPaintEngine *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
        QPainter::pen((QPainter *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
        QPen::brush((QPen *)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218));
        QPainter::fillPath(this_00,(QPainterPath *)
                                   CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220),
                           (QBrush *)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218));
        QBrush::~QBrush((QBrush *)0x5587e6);
        painter((QPaintEngine *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
        QPainter::restore((QPainter *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288))
        ;
      }
      QPainterPath::~QPainterPath((QPainterPath *)0x558808);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPaintEngine::drawTextItem(const QPointF &p, const QTextItem &textItem)
{
    const QTextItemInt &ti = static_cast<const QTextItemInt &>(textItem);
    if (ti.glyphs.numGlyphs == 0)
        return;

    if (ti.fontEngine->glyphFormat == QFontEngine::Format_ARGB) {
        QVarLengthArray<QFixedPoint> positions;
        QVarLengthArray<glyph_t> glyphs;
        QTransform matrix = QTransform::fromTranslate(p.x(), p.y() - ti.fontEngine->ascent().toReal());
        ti.fontEngine->getGlyphPositions(ti.glyphs, matrix, ti.flags, glyphs, positions);
        painter()->save();
        painter()->setRenderHint(QPainter::SmoothPixmapTransform,
                                 bool((painter()->renderHints() & QPainter::TextAntialiasing)
                                      && !(painter()->font().styleStrategy() & QFont::NoAntialias)));
        for (int i = 0; i < ti.glyphs.numGlyphs; ++i) {
            QImage glyph = ti.fontEngine->bitmapForGlyph(glyphs[i], QFixedPoint(), QTransform());
            painter()->drawImage(positions[i].x.toReal(), positions[i].y.toReal(), glyph);
        }
        painter()->restore();
        return;
    }

    QPainterPath path;
    path.setFillRule(Qt::WindingFill);
    ti.fontEngine->addOutlineToPath(0, 0, ti.glyphs, &path, ti.flags);
    if (!path.isEmpty()) {
        painter()->save();
        painter()->setRenderHint(QPainter::Antialiasing,
                                 bool((painter()->renderHints() & QPainter::TextAntialiasing)
                                      && !(painter()->font().styleStrategy() & QFont::NoAntialias)));
        painter()->translate(p.x(), p.y());
        painter()->fillPath(path, painter()->pen().brush());
        painter()->restore();
    }
}